

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O2

ByteData * __thiscall
cfd::core::SchnorrSignature::GetData
          (ByteData *__return_storage_ptr__,SchnorrSignature *this,bool append_sighash_type)

{
  uint32_t uVar1;
  size_t sVar2;
  undefined7 in_register_00000011;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  if ((int)CONCAT71(in_register_00000011,append_sighash_type) != 0) {
    uVar1 = SigHashType::GetSigHashFlag(&this->sighash_type_);
    if ((uVar1 != 0) && (sVar2 = ByteData::GetDataSize(&this->data_), sVar2 == 0x40)) {
      uVar1 = SigHashType::GetSigHashFlag(&this->sighash_type_);
      ByteData::ByteData((ByteData *)&local_30,(uint8_t)uVar1);
      ByteData::Concat<cfd::core::ByteData>
                (__return_storage_ptr__,&this->data_,(ByteData *)&local_30);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
      return __return_storage_ptr__;
    }
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  return __return_storage_ptr__;
}

Assistant:

ByteData SchnorrSignature::GetData(bool append_sighash_type) const {
  if ((!append_sighash_type) || (sighash_type_.GetSigHashFlag() == 0) ||
      (data_.GetDataSize() != SchnorrSignature::kSchnorrSignatureSize)) {
    return data_;
  }

  uint8_t sighash_type = static_cast<uint8_t>(sighash_type_.GetSigHashFlag());
  return data_.Concat(ByteData(sighash_type));
}